

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int expand(archive_read *a,int64_t *end)

{
  rar *rar_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  rar_br *br_00;
  int64_t iVar4;
  rar_br *br;
  rar *rar;
  uchar newfile;
  int lowoffsetsymbol;
  int offssymbol;
  int i;
  int lensymbol;
  int offsindex;
  int len;
  int offs;
  int symbol;
  int64_t *end_local;
  archive_read *a_local;
  
  rar_00 = (rar *)a->format->data;
  br_00 = &rar_00->br;
  if ((rar_00->filters).filterstart < *end) {
    *end = (rar_00->filters).filterstart;
  }
LAB_00165ec8:
  do {
    while( true ) {
      while( true ) {
        iVar4 = lzss_position(&rar_00->lzss);
        if (*end <= iVar4) {
          return 0;
        }
        if (rar_00->is_ppmd_block != '\0') {
          iVar4 = lzss_position(&rar_00->lzss);
          *end = iVar4;
          return 0;
        }
        iVar1 = read_next_symbol(a,&rar_00->maincode);
        if (iVar1 < 0) {
          return -0x1e;
        }
        if (0xff < iVar1) break;
        lzss_emit_literal(rar_00,(uint8_t)iVar1);
      }
      if (iVar1 != 0x100) break;
      if ((((rar_00->br).cache_avail < 1) && (iVar1 = rar_br_fillup(a,br_00), iVar1 == 0)) &&
         ((rar_00->br).cache_avail < 1)) {
LAB_00166831:
        archive_set_error(&a->archive,0x54,"Truncated RAR file data");
        rar_00->valid = '\0';
        return -0x1e;
      }
      iVar1 = (rar_00->br).cache_avail;
      (rar_00->br).cache_avail = (rar_00->br).cache_avail + -1;
      if ((br_00->cache_buffer >> ((char)iVar1 - 1U & 0x3f) & (ulong)1) == 0) {
        rar_00->start_new_block = '\x01';
        if (((0 < (rar_00->br).cache_avail) || (iVar1 = rar_br_fillup(a,br_00), iVar1 != 0)) ||
           (0 < (rar_00->br).cache_avail)) {
          rar_00->start_new_table =
               (byte)(br_00->cache_buffer >> ((char)(rar_00->br).cache_avail - 1U & 0x3f)) & 1;
          (rar_00->br).cache_avail = (rar_00->br).cache_avail + -1;
          iVar4 = lzss_position(&rar_00->lzss);
          *end = iVar4;
          return 0;
        }
        goto LAB_00166831;
      }
      iVar1 = parse_codes(a);
      if (iVar1 != 0) {
        return -0x1e;
      }
    }
    if (iVar1 != 0x101) {
      if (iVar1 == 0x102) {
        if (rar_00->lastlength == 0) goto LAB_00165ec8;
        offsindex = rar_00->lastoffset;
        lensymbol = rar_00->lastlength;
      }
      else if (iVar1 < 0x107) {
        lowoffsetsymbol = iVar1 + -0x103;
        offsindex = rar_00->oldoffset[lowoffsetsymbol];
        iVar1 = read_next_symbol(a,&rar_00->lengthcode);
        if ((iVar1 < 0) || (0x1b < iVar1)) goto LAB_0016685c;
        lensymbol = ""[iVar1] + 2;
        if (""[iVar1] != '\0') {
          if ((((rar_00->br).cache_avail < (int)(uint)""[iVar1]) &&
              (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
             ((rar_00->br).cache_avail < (int)(uint)""[iVar1])) goto LAB_00166831;
          lensymbol = ((uint)(br_00->cache_buffer >>
                             ((char)(rar_00->br).cache_avail - ""[iVar1] & 0x3f)) &
                      cache_masks[""[iVar1]]) + lensymbol;
          (rar_00->br).cache_avail = (rar_00->br).cache_avail - (uint)""[iVar1];
        }
        for (; 0 < lowoffsetsymbol; lowoffsetsymbol = lowoffsetsymbol + -1) {
          rar_00->oldoffset[lowoffsetsymbol] = rar_00->oldoffset[lowoffsetsymbol + -1];
        }
        rar_00->oldoffset[0] = offsindex;
      }
      else if (iVar1 < 0x10f) {
        offsindex = ""[iVar1 + -0x107] + 1;
        if ("\x02\x02\x03\x04\x05\x06\x06\x06"[iVar1 + -0x107] != '\0') {
          if ((((rar_00->br).cache_avail <
                (int)(uint)"\x02\x02\x03\x04\x05\x06\x06\x06"[iVar1 + -0x107]) &&
              (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
             ((rar_00->br).cache_avail <
              (int)(uint)"\x02\x02\x03\x04\x05\x06\x06\x06"[iVar1 + -0x107])) goto LAB_00166831;
          offsindex = ((uint)(br_00->cache_buffer >>
                             ((char)(rar_00->br).cache_avail -
                              "\x02\x02\x03\x04\x05\x06\x06\x06"[iVar1 + -0x107] & 0x3f)) &
                      cache_masks["\x02\x02\x03\x04\x05\x06\x06\x06"[iVar1 + -0x107]]) + offsindex;
          (rar_00->br).cache_avail =
               (rar_00->br).cache_avail - (uint)"\x02\x02\x03\x04\x05\x06\x06\x06"[iVar1 + -0x107];
        }
        lensymbol = 2;
        for (lowoffsetsymbol = 3; 0 < lowoffsetsymbol; lowoffsetsymbol = lowoffsetsymbol + -1) {
          rar_00->oldoffset[lowoffsetsymbol] = rar_00->oldoffset[lowoffsetsymbol + -1];
        }
        rar_00->oldoffset[0] = offsindex;
      }
      else {
        if (0x1b < iVar1 + -0x10f) {
LAB_0016685c:
          archive_set_error(&a->archive,0x54,"Bad RAR file data");
          return -0x1e;
        }
        lensymbol = ""[iVar1 + -0x10f] + 3;
        if (""[iVar1 + -0x10f] != '\0') {
          if ((((rar_00->br).cache_avail < (int)(uint)""[iVar1 + -0x10f]) &&
              (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
             ((rar_00->br).cache_avail < (int)(uint)""[iVar1 + -0x10f])) goto LAB_00166831;
          lensymbol = ((uint)(br_00->cache_buffer >>
                             ((char)(rar_00->br).cache_avail - ""[iVar1 + -0x10f] & 0x3f)) &
                      cache_masks[""[iVar1 + -0x10f]]) + lensymbol;
          (rar_00->br).cache_avail = (rar_00->br).cache_avail - (uint)""[iVar1 + -0x10f];
        }
        iVar1 = read_next_symbol(a,&rar_00->offsetcode);
        if ((iVar1 < 0) || (0x3b < iVar1)) goto LAB_0016685c;
        offsindex = expand::offsetbases[iVar1] + 1;
        if (""[iVar1] != '\0') {
          if (iVar1 < 10) {
            if ((((rar_00->br).cache_avail < (int)(uint)""[iVar1]) &&
                (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
               ((rar_00->br).cache_avail < (int)(uint)""[iVar1])) goto LAB_00166831;
            offsindex = ((uint)(br_00->cache_buffer >>
                               ((char)(rar_00->br).cache_avail - ""[iVar1] & 0x3f)) &
                        cache_masks[""[iVar1]]) + offsindex;
            (rar_00->br).cache_avail = (rar_00->br).cache_avail - (uint)""[iVar1];
          }
          else {
            if (4 < ""[iVar1]) {
              if ((((rar_00->br).cache_avail < (int)(""[iVar1] - 4)) &&
                  (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
                 ((rar_00->br).cache_avail < (int)(""[iVar1] - 4))) goto LAB_00166831;
              offsindex = ((uint)(br_00->cache_buffer >>
                                 ((char)(rar_00->br).cache_avail - (""[iVar1] + 0xfc) & 0x3f)) &
                          cache_masks[(int)(""[iVar1] - 4)]) * 0x10 + offsindex;
              (rar_00->br).cache_avail = (rar_00->br).cache_avail - (""[iVar1] - 4);
            }
            if (rar_00->numlowoffsetrepeats == 0) {
              uVar3 = read_next_symbol(a,&rar_00->lowoffsetcode);
              if ((int)uVar3 < 0) {
                return -0x1e;
              }
              if (uVar3 == 0x10) {
                rar_00->numlowoffsetrepeats = 0xf;
                uVar3 = rar_00->lastlowoffset;
              }
              else {
                rar_00->lastlowoffset = uVar3;
              }
            }
            else {
              rar_00->numlowoffsetrepeats = rar_00->numlowoffsetrepeats - 1;
              uVar3 = rar_00->lastlowoffset;
            }
            offsindex = uVar3 + offsindex;
          }
        }
        if (0x3ffff < offsindex) {
          lensymbol = lensymbol + 1;
        }
        if (0x1fff < offsindex) {
          lensymbol = lensymbol + 1;
        }
        for (lowoffsetsymbol = 3; 0 < lowoffsetsymbol; lowoffsetsymbol = lowoffsetsymbol + -1) {
          rar_00->oldoffset[lowoffsetsymbol] = rar_00->oldoffset[lowoffsetsymbol + -1];
        }
        rar_00->oldoffset[0] = offsindex;
      }
      rar_00->lastoffset = offsindex;
      rar_00->lastlength = lensymbol;
      lzss_emit_match(rar_00,rar_00->lastoffset,rar_00->lastlength);
      goto LAB_00165ec8;
    }
    iVar1 = read_filter(a,end);
    if (iVar1 == 0) {
      return -0x1e;
    }
  } while( true );
}

Assistant:

static int
expand(struct archive_read *a, int64_t *end)
{
  static const unsigned char lengthbases[] =
    {   0,   1,   2,   3,   4,   5,   6,
        7,   8,  10,  12,  14,  16,  20,
       24,  28,  32,  40,  48,  56,  64,
       80,  96, 112, 128, 160, 192, 224 };
  static const unsigned char lengthbits[] =
    { 0, 0, 0, 0, 0, 0, 0,
      0, 1, 1, 1, 1, 2, 2,
      2, 2, 3, 3, 3, 3, 4,
      4, 4, 4, 5, 5, 5, 5 };
  static const int lengthb_min = minimum(
    (int)(sizeof(lengthbases)/sizeof(lengthbases[0])),
    (int)(sizeof(lengthbits)/sizeof(lengthbits[0]))
  );
  static const unsigned int offsetbases[] =
    {       0,       1,       2,       3,       4,       6,
            8,      12,      16,      24,      32,      48,
           64,      96,     128,     192,     256,     384,
          512,     768,    1024,    1536,    2048,    3072,
         4096,    6144,    8192,   12288,   16384,   24576,
        32768,   49152,   65536,   98304,  131072,  196608,
       262144,  327680,  393216,  458752,  524288,  589824,
       655360,  720896,  786432,  851968,  917504,  983040,
      1048576, 1310720, 1572864, 1835008, 2097152, 2359296,
      2621440, 2883584, 3145728, 3407872, 3670016, 3932160 };
  static const unsigned char offsetbits[] =
    {  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,
       5,  5,  6,  6,  7,  7,  8,  8,  9,  9, 10, 10,
      11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
      18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18 };
  static const int offsetb_min = minimum(
    (int)(sizeof(offsetbases)/sizeof(offsetbases[0])),
    (int)(sizeof(offsetbits)/sizeof(offsetbits[0]))
  );
  static const unsigned char shortbases[] =
    { 0, 4, 8, 16, 32, 64, 128, 192 };
  static const unsigned char shortbits[] =
    { 2, 2, 3, 4, 5, 6, 6, 6 };

  int symbol, offs, len, offsindex, lensymbol, i, offssymbol, lowoffsetsymbol;
  unsigned char newfile;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  if (rar->filters.filterstart < *end)
    *end = rar->filters.filterstart;

  while (1)
  {
    if(lzss_position(&rar->lzss) >= *end) {
      return (ARCHIVE_OK);
    }

    if(rar->is_ppmd_block) {
      *end = lzss_position(&rar->lzss);
      return (ARCHIVE_OK);
    }

    if ((symbol = read_next_symbol(a, &rar->maincode)) < 0)
      return (ARCHIVE_FATAL);

    if (symbol < 256)
    {
      lzss_emit_literal(rar, symbol);
      continue;
    }
    else if (symbol == 256)
    {
      if (!rar_br_read_ahead(a, br, 1))
        goto truncated_data;
      newfile = !rar_br_bits(br, 1);
      rar_br_consume(br, 1);

      if(newfile)
      {
        rar->start_new_block = 1;
        if (!rar_br_read_ahead(a, br, 1))
          goto truncated_data;
        rar->start_new_table = rar_br_bits(br, 1);
        rar_br_consume(br, 1);
        *end = lzss_position(&rar->lzss);
        return (ARCHIVE_OK);
      }
      else
      {
        if (parse_codes(a) != ARCHIVE_OK)
          return (ARCHIVE_FATAL);
        continue;
      }
    }
    else if(symbol==257)
    {
      if (!read_filter(a, end))
          return (ARCHIVE_FATAL);
      continue;
    }
    else if(symbol==258)
    {
      if(rar->lastlength == 0)
        continue;

      offs = rar->lastoffset;
      len = rar->lastlength;
    }
    else if (symbol <= 262)
    {
      offsindex = symbol - 259;
      offs = rar->oldoffset[offsindex];

      if ((lensymbol = read_next_symbol(a, &rar->lengthcode)) < 0)
        goto bad_data;
      if (lensymbol >= lengthb_min)
        goto bad_data;
      len = lengthbases[lensymbol] + 2;
      if (lengthbits[lensymbol] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[lensymbol]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[lensymbol]);
        rar_br_consume(br, lengthbits[lensymbol]);
      }

      for (i = offsindex; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else if(symbol<=270)
    {
      offs = shortbases[symbol-263] + 1;
      if(shortbits[symbol-263] > 0) {
        if (!rar_br_read_ahead(a, br, shortbits[symbol-263]))
          goto truncated_data;
        offs += rar_br_bits(br, shortbits[symbol-263]);
        rar_br_consume(br, shortbits[symbol-263]);
      }

      len = 2;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else
    {
      if (symbol-271 >= lengthb_min)
        goto bad_data;
      len = lengthbases[symbol-271]+3;
      if(lengthbits[symbol-271] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[symbol-271]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[symbol-271]);
        rar_br_consume(br, lengthbits[symbol-271]);
      }

      if ((offssymbol = read_next_symbol(a, &rar->offsetcode)) < 0)
        goto bad_data;
      if (offssymbol >= offsetb_min)
        goto bad_data;
      offs = offsetbases[offssymbol]+1;
      if(offsetbits[offssymbol] > 0)
      {
        if(offssymbol > 9)
        {
          if(offsetbits[offssymbol] > 4) {
            if (!rar_br_read_ahead(a, br, offsetbits[offssymbol] - 4))
              goto truncated_data;
            offs += rar_br_bits(br, offsetbits[offssymbol] - 4) << 4;
            rar_br_consume(br, offsetbits[offssymbol] - 4);
          }

          if(rar->numlowoffsetrepeats > 0)
          {
            rar->numlowoffsetrepeats--;
            offs += rar->lastlowoffset;
          }
          else
          {
            if ((lowoffsetsymbol =
              read_next_symbol(a, &rar->lowoffsetcode)) < 0)
              return (ARCHIVE_FATAL);
            if(lowoffsetsymbol == 16)
            {
              rar->numlowoffsetrepeats = 15;
              offs += rar->lastlowoffset;
            }
            else
            {
              offs += lowoffsetsymbol;
              rar->lastlowoffset = lowoffsetsymbol;
            }
          }
        }
        else {
          if (!rar_br_read_ahead(a, br, offsetbits[offssymbol]))
            goto truncated_data;
          offs += rar_br_bits(br, offsetbits[offssymbol]);
          rar_br_consume(br, offsetbits[offssymbol]);
        }
      }

      if (offs >= 0x40000)
        len++;
      if (offs >= 0x2000)
        len++;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }

    rar->lastoffset = offs;
    rar->lastlength = len;

    lzss_emit_match(rar, rar->lastoffset, rar->lastlength);
  }
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
bad_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}